

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEdge.c
# Opt level: O1

int Edg_ManAssignEdgeNew(Gia_Man_t *p,int nEdges,int fVerbose)

{
  void *__ptr;
  uint DelayMax;
  int iVar1;
  int iVar2;
  Vec_Wec_t *vEdges;
  Vec_Int_t *pVVar3;
  int *piVar4;
  uint uVar5;
  ulong uVar6;
  size_t __nmemb;
  long lVar7;
  size_t sVar8;
  size_t sVar9;
  uint local_70;
  Vec_Int_t *local_68;
  Vec_Int_t *local_60;
  ulong local_48;
  
  vEdges = (Vec_Wec_t *)malloc(0x10);
  vEdges->nCap = 0;
  vEdges->nSize = 0;
  vEdges->pArray = (Vec_Int_t *)0x0;
  if (fVerbose != 0) {
    printf("Running edge assignment with E = %d.\n");
  }
  Edg_ManToMapping(p);
  if (p->vEdge1 != (Vec_Int_t *)0x0) {
    piVar4 = p->vEdge1->pArray;
    if (piVar4 != (int *)0x0) {
      free(piVar4);
      p->vEdge1->pArray = (int *)0x0;
    }
    if (p->vEdge1 != (Vec_Int_t *)0x0) {
      free(p->vEdge1);
      p->vEdge1 = (Vec_Int_t *)0x0;
    }
  }
  if (p->vEdge2 != (Vec_Int_t *)0x0) {
    piVar4 = p->vEdge2->pArray;
    if (piVar4 != (int *)0x0) {
      free(piVar4);
      p->vEdge2->pArray = (int *)0x0;
    }
    if (p->vEdge2 != (Vec_Int_t *)0x0) {
      free(p->vEdge2);
      p->vEdge2 = (Vec_Int_t *)0x0;
    }
  }
  iVar1 = p->nObjs;
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  iVar2 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar2 = iVar1;
  }
  pVVar3->nSize = 0;
  pVVar3->nCap = iVar2;
  if (iVar2 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)iVar2 * 4);
  }
  pVVar3->pArray = piVar4;
  pVVar3->nSize = iVar1;
  if (piVar4 != (int *)0x0) {
    memset(piVar4,0,(long)iVar1 * 4);
  }
  p->vEdge1 = pVVar3;
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  pVVar3->nSize = 0;
  pVVar3->nCap = iVar2;
  if (iVar2 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)iVar2 << 2);
  }
  pVVar3->pArray = piVar4;
  pVVar3->nSize = iVar1;
  if (piVar4 != (int *)0x0) {
    memset(piVar4,0,(long)iVar1 << 2);
  }
  p->vEdge2 = pVVar3;
  local_70 = 1000000000;
  local_48 = 0xffffffff;
  uVar6 = 0;
  local_60 = (Vec_Int_t *)0x0;
  local_68 = (Vec_Int_t *)0x0;
  do {
    DelayMax = Edg_ManEvalEdgeDelay(p);
    iVar1 = Edg_ManEvalEdgeDelayR(p);
    if (DelayMax != iVar1 + 1U) {
      __assert_fail("DelayD == DelayR + DelayNoEdge",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEdge.c"
                    ,0x3b2,"int Edg_ManAssignEdgeNew(Gia_Man_t *, int, int)");
    }
    if ((int)DelayMax < (int)local_70) {
      if (local_68 != (Vec_Int_t *)0x0) {
        if (local_68->pArray != (int *)0x0) {
          free(local_68->pArray);
          local_68->pArray = (int *)0x0;
        }
        free(local_68);
      }
      pVVar3 = p->vEdge1;
      local_68 = (Vec_Int_t *)malloc(0x10);
      iVar1 = pVVar3->nSize;
      lVar7 = (long)iVar1;
      local_68->nSize = iVar1;
      local_68->nCap = iVar1;
      if (lVar7 == 0) {
        piVar4 = (int *)0x0;
      }
      else {
        piVar4 = (int *)malloc(lVar7 * 4);
      }
      local_68->pArray = piVar4;
      memcpy(piVar4,pVVar3->pArray,lVar7 << 2);
      if (local_60 != (Vec_Int_t *)0x0) {
        if (local_60->pArray != (int *)0x0) {
          free(local_60->pArray);
          local_60->pArray = (int *)0x0;
        }
        free(local_60);
      }
      pVVar3 = p->vEdge2;
      local_60 = (Vec_Int_t *)malloc(0x10);
      iVar1 = pVVar3->nSize;
      lVar7 = (long)iVar1;
      local_60->nSize = iVar1;
      local_60->nCap = iVar1;
      if (lVar7 == 0) {
        piVar4 = (int *)0x0;
      }
      else {
        piVar4 = (int *)malloc(lVar7 * 4);
      }
      local_60->pArray = piVar4;
      memcpy(piVar4,pVVar3->pArray,lVar7 << 2);
      local_70 = DelayMax;
      local_48 = uVar6;
    }
    if (fVerbose != 0) {
      printf("\nIter %4d : Delay = %4d\n",uVar6,(ulong)DelayMax);
    }
    Edg_ManCollectCritEdges(p,vEdges,DelayMax);
    pVVar3 = vEdges->pArray;
    iVar1 = vEdges->nSize;
    __nmemb = (size_t)iVar1;
    qsort(pVVar3,__nmemb,0x10,Vec_WecSortCompare1);
    sVar8 = 0;
    sVar9 = sVar8;
    if (0 < (long)__nmemb) {
      do {
        if (pVVar3[sVar8].nSize < 1) {
          lVar7 = 0;
        }
        else {
          lVar7 = 0;
          do {
            iVar2 = Edg_ObjImprove(p,pVVar3[sVar8].pArray[lVar7],nEdges,DelayMax,fVerbose);
            if (iVar2 != 0) break;
            lVar7 = lVar7 + 1;
          } while (lVar7 < pVVar3[sVar8].nSize);
        }
        sVar9 = sVar8;
      } while ((pVVar3[sVar8].nSize <= (int)lVar7) &&
              (sVar8 = sVar8 + 1, sVar9 = __nmemb, sVar8 != __nmemb));
    }
    if (((int)sVar9 == iVar1) ||
       ((uVar5 = (uint)uVar6, 0x270e < uVar5 ||
        (uVar6 = (ulong)(uVar5 + 1), (int)local_48 + 0x32 <= (int)uVar5)))) {
      iVar1 = vEdges->nCap;
      if (0 < (long)iVar1) {
        pVVar3 = vEdges->pArray;
        lVar7 = 0;
        do {
          __ptr = *(void **)((long)&pVVar3->pArray + lVar7);
          if (__ptr != (void *)0x0) {
            free(__ptr);
            *(undefined8 *)((long)&pVVar3->pArray + lVar7) = 0;
          }
          lVar7 = lVar7 + 0x10;
        } while ((long)iVar1 * 0x10 != lVar7);
      }
      if (vEdges->pArray != (Vec_Int_t *)0x0) {
        free(vEdges->pArray);
        vEdges->pArray = (Vec_Int_t *)0x0;
      }
      vEdges->nCap = 0;
      vEdges->nSize = 0;
      free(vEdges);
      if (p->vEdge1 != (Vec_Int_t *)0x0) {
        piVar4 = p->vEdge1->pArray;
        if (piVar4 != (int *)0x0) {
          free(piVar4);
          p->vEdge1->pArray = (int *)0x0;
        }
        if (p->vEdge1 != (Vec_Int_t *)0x0) {
          free(p->vEdge1);
          p->vEdge1 = (Vec_Int_t *)0x0;
        }
      }
      p->vEdge1 = local_68;
      if (p->vEdge2 != (Vec_Int_t *)0x0) {
        piVar4 = p->vEdge2->pArray;
        if (piVar4 != (int *)0x0) {
          free(piVar4);
          p->vEdge2->pArray = (int *)0x0;
        }
        if (p->vEdge2 != (Vec_Int_t *)0x0) {
          free(p->vEdge2);
          p->vEdge2 = (Vec_Int_t *)0x0;
        }
      }
      p->vEdge2 = local_60;
      return DelayMax;
    }
  } while( true );
}

Assistant:

int Edg_ManAssignEdgeNew( Gia_Man_t * p, int nEdges, int fVerbose )
{
    int DelayNoEdge = 1;
    int fLevelVerbose = 0;
    Vec_Int_t * vLevel;
    Vec_Wec_t * vEdges = Vec_WecStart(0);
    Vec_Int_t * vEdge1 = NULL, * vEdge2 = NULL;
    int DelayD = 0, DelayR = 0, DelayPrev = ABC_INFINITY;
    int k, j, i, iLast = -1, iObj;
    if ( fVerbose )
        printf( "Running edge assignment with E = %d.\n", nEdges );
    // create fanouts
    Edg_ManToMapping( p );
    // create empty assignment
    Vec_IntFreeP( &p->vEdge1 );
    Vec_IntFreeP( &p->vEdge2 );
    p->vEdge1 = Vec_IntStart( Gia_ManObjNum(p) );
    p->vEdge2 = Vec_IntStart( Gia_ManObjNum(p) );
    // perform optimization
    for ( i = 0; i < 10000; i++ )
    {
        // if there is no improvement after 10 iterations, quit
        if ( i > iLast + 50 )
            break;
        // create delay information
        DelayD = Edg_ManEvalEdgeDelay( p );
        DelayR = Edg_ManEvalEdgeDelayR( p );
        assert( DelayD == DelayR + DelayNoEdge );
        if ( DelayPrev > DelayD )
        {
            //printf( "Saving backup point at %d levels.\n", DelayD );
            Vec_IntFreeP( &vEdge1 );  vEdge1 = Vec_IntDup( p->vEdge1 );
            Vec_IntFreeP( &vEdge2 );  vEdge2 = Vec_IntDup( p->vEdge2 );
            DelayPrev = DelayD;
            iLast = i;
        }
        if ( fVerbose )
            printf( "\nIter %4d : Delay = %4d\n", i, DelayD );
        // collect critical nodes (nodes with critical edges)
        Edg_ManCollectCritEdges( p, vEdges, DelayD );
        // sort levels according to the number of critical edges
        if ( fLevelVerbose )
        {
            Vec_WecForEachLevel( vEdges, vLevel, k )
                Vec_IntPush( vLevel, k );
        }
        Vec_WecSort( vEdges, 0 );
        if ( fLevelVerbose )
        {
            Vec_WecForEachLevel( vEdges, vLevel, k )
            {
                int Level = Vec_IntPop( vLevel );
                printf( "%d: Level %2d : ", k, Level );
                Vec_IntPrint( vLevel );
            }
        }
        Vec_WecForEachLevel( vEdges, vLevel, k )
        {
            Vec_IntForEachEntry( vLevel, iObj, j )
                if ( Edg_ObjImprove(p, iObj, nEdges, DelayD, fVerbose) ) // improved
                    break;
            if ( j < Vec_IntSize(vLevel) )
                break;
        }
        if ( k == Vec_WecSize(vEdges) ) // if we could not improve anything, quit
            break;
    }
    Vec_WecFree( vEdges );
    // update to the saved version
    Vec_IntFreeP( &p->vEdge1 );  p->vEdge1 = vEdge1;
    Vec_IntFreeP( &p->vEdge2 );  p->vEdge2 = vEdge2;
    return DelayD;
}